

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void __thiscall
mxx::custom_op<std::pair<unsigned_long,unsigned_long>,true>::
custom_op<pair_sum<unsigned_long,unsigned_long>>
          (custom_op<std::pair<unsigned_long,unsigned_long>,true> *this)

{
  MPI_Datatype poVar1;
  int local_54;
  undefined1 local_50 [8];
  datatype dt;
  type local_28;
  custom_op<std::pair<unsigned_long,unsigned_long>,true> *local_18;
  custom_op<std::pair<unsigned_long,_unsigned_long>,_true> *this_local;
  
  *(undefined ***)this = &PTR__custom_op_002b7fb0;
  local_18 = this;
  std::function<void_(void_*,_void_*,_int_*)>::function
            ((function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  this[0x28] = (custom_op<std::pair<unsigned_long,unsigned_long>,true>)0x0;
  if (((byte)this[0x28] & 1) == 0) {
    std::
    bind<void(&)(pair_sum<unsigned_long,unsigned_long>,void*,void*,int*),pair_sum<unsigned_long,unsigned_long>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              (&local_28,custom_function<pair_sum<unsigned_long,unsigned_long>>,
               (pair_sum<unsigned_long,_unsigned_long> *)((long)&this_local + 7),
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
               (_Placeholder<3> *)&std::placeholders::_3);
    std::function<void(void*,void*,int*)>::operator=
              ((function<void(void*,void*,int*)> *)(this + 8),&local_28);
    get_datatype<std::pair<unsigned_long,unsigned_long>>();
    poVar1 = mxx::datatype::type((datatype *)local_50);
    MPI_Type_dup(poVar1,this + 0x30);
    local_54 = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
              ((MPI_Datatype *)(this + 0x30),&local_54,
               (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
    MPI_Op_create(custom_op<std::pair<unsigned_long,_unsigned_long>,_true>::mpi_user_function,1,
                  this + 0x38);
    mxx::datatype::~datatype((datatype *)local_50);
  }
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }